

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_exporter.cpp
# Opt level: O3

void do_export_cl_csv_pdb(Params *params)

{
  size_type *psVar1;
  pointer *ppPVar2;
  int iVar3;
  pointer pcVar4;
  pointer piVar5;
  iterator __position;
  bool bVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  ostream *poVar12;
  DIR *__dirp;
  dirent *pdVar13;
  size_t sVar14;
  undefined8 *puVar15;
  istream *piVar16;
  uint uVar17;
  ulong uVar18;
  pointer pbVar19;
  ulong uVar20;
  char *__s;
  pointer pvVar21;
  bool bVar22;
  string pdb_path;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  confs_ls;
  vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  confs;
  Point atom;
  ofstream fls;
  string local_348;
  string local_328;
  ulong local_308;
  uint local_2fc;
  string local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  local_2b8;
  string local_2a0;
  vector<int,_std::allocator<int>_> local_280;
  Point local_268;
  vector<Point,std::allocator<Point>> *local_250;
  vector<int,_std::allocator<int>_> *local_248;
  pointer local_240;
  ulong *local_238;
  long lStack_230;
  ulong local_228 [2];
  int aiStack_218 [54];
  ios_base local_140 [272];
  
  local_2b8.
  super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308 = 0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar17 = 0x7fffffff;
  if (0 < params->export_cl_csv_pdb_max) {
    uVar17 = params->export_cl_csv_pdb_max;
  }
  pbVar19 = (params->export_cl_csv_pdb_in_dirs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar19 !=
      (params->export_cl_csv_pdb_in_dirs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_248 = &params->ends;
    local_2fc = uVar17;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Loading PDBs from: ",0x13);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(pbVar19->_M_dataplus)._M_p,
                           pbVar19->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      __dirp = opendir((pbVar19->_M_dataplus)._M_p);
      if (__dirp == (DIR *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: could not open PDB directory: ",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(pbVar19->_M_dataplus)._M_p,pbVar19->_M_string_length);
        goto LAB_00119815;
      }
      do {
        do {
          pdVar13 = readdir(__dirp);
          if (pdVar13 == (dirent *)0x0) goto LAB_0011961a;
          __s = pdVar13->d_name;
          sVar14 = strlen(__s);
        } while ((sVar14 < 5) || (iVar10 = strncmp(__s + (sVar14 - 4),".pdb",4), iVar10 != 0));
        local_238 = local_228;
        pcVar4 = (pbVar19->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,pcVar4,pcVar4 + pbVar19->_M_string_length);
        std::__cxx11::string::append((char *)&local_238);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        sVar14 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,__s,__s + sVar14);
        uVar20 = 0xf;
        if (local_238 != local_228) {
          uVar20 = local_228[0];
        }
        if (uVar20 < local_328._M_string_length + lStack_230) {
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            uVar20 = CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                              local_328.field_2._M_local_buf[0]);
          }
          if (uVar20 < local_328._M_string_length + lStack_230) goto LAB_00118ffc;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,(ulong)local_238);
        }
        else {
LAB_00118ffc:
          puVar15 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_238,(ulong)local_328._M_dataplus._M_p);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        psVar1 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_348.field_2._M_allocated_capacity = *psVar1;
          local_348.field_2._8_8_ = puVar15[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *psVar1;
          local_348._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_348._M_string_length = puVar15[1];
        *puVar15 = psVar1;
        puVar15[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        if (local_238 != local_228) {
          operator_delete(local_238);
        }
        local_238 = (ulong *)0x0;
        lStack_230 = 0;
        local_228[0] = 0;
        std::
        vector<std::vector<Point,std::allocator<Point>>,std::allocator<std::vector<Point,std::allocator<Point>>>>
        ::emplace_back<std::vector<Point,std::allocator<Point>>>
                  ((vector<std::vector<Point,std::allocator<Point>>,std::allocator<std::vector<Point,std::allocator<Point>>>>
                    *)&local_2b8,(vector<Point,_std::allocator<Point>_> *)&local_238);
        if (local_238 != (ulong *)0x0) {
          operator_delete(local_238);
        }
        pvVar21 = local_2b8.
                  super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        std::vector<int,_std::allocator<int>_>::vector(&local_280,local_248);
        if (pvVar21[-1].super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pvVar21[-1].super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          __assert_fail("conf.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                        ,0x7a,
                        "bool (anonymous namespace)::load_conf(SlimStruct &, const std::string &, const std::vector<int> &, const std::vector<int>, const bool)"
                       );
        }
        if (local_348._M_string_length == 0) {
          __assert_fail("!pdb_path.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                        ,0x7b,
                        "bool (anonymous namespace)::load_conf(SlimStruct &, const std::string &, const std::vector<int> &, const std::vector<int>, const bool)"
                       );
        }
        if ((params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          __assert_fail("!starts.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                        ,0x7c,
                        "bool (anonymous namespace)::load_conf(SlimStruct &, const std::string &, const std::vector<int> &, const std::vector<int>, const bool)"
                       );
        }
        if (local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start ==
            local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          __assert_fail("!ends.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                        ,0x7d,
                        "bool (anonymous namespace)::load_conf(SlimStruct &, const std::string &, const std::vector<int> &, const std::vector<int>, const bool)"
                       );
        }
        bVar9 = params->export_cl_csv_pdb_bbone_only;
        bVar6 = FileExists(&local_348);
        if (bVar6) {
          local_268.x = 0.0;
          local_268.y = 0.0;
          local_268.z = 0.0;
          std::ifstream::ifstream((istream *)&local_238,(string *)&local_348,_S_in);
          local_250 = (vector<Point,std::allocator<Point>> *)(pvVar21 + -1);
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          local_2f8._M_string_length = 0;
          local_2f8.field_2._M_local_buf[0] = '\0';
          local_240 = pvVar21;
          while( true ) {
            cVar7 = std::ios::widen((char)local_238[-3] + (char)(istream *)&local_238);
            piVar16 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&local_238,(string *)&local_2f8,cVar7);
            if (((byte)piVar16[*(long *)(*(long *)piVar16 + -0x18) + 0x20] & 5) != 0) break;
            if ((local_2f8._M_string_length != 0) && (bVar8 = Pdb::is_atom_rec(&local_2f8), bVar8))
            {
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              local_2a0._M_string_length = 0;
              local_2a0.field_2._M_local_buf[0] = '\0';
              Pdb::get_atom_rec_token(&local_2a0,&local_2f8,PdbAtomResSeqNo);
              iVar10 = atoi(local_2a0._M_dataplus._M_p);
              if (iVar10 < 1) {
                __assert_fail("res_ix >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/util.h"
                              ,0x4b,
                              "bool is_in_simulated_region(const int, const std::vector<int> &, const std::vector<int> &)"
                             );
              }
              piVar5 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar20 = (long)(params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar5;
              if (uVar20 != (long)local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) {
                __assert_fail("starts.size() == ends.size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/util.h"
                              ,0x4c,
                              "bool is_in_simulated_region(const int, const std::vector<int> &, const std::vector<int> &)"
                             );
              }
              uVar17 = (uint)(uVar20 >> 2);
              if (0 < (int)uVar17) {
                uVar18 = (ulong)(uVar17 & 0x7fffffff);
                bVar8 = true;
                uVar20 = 1;
                do {
                  iVar3 = piVar5[uVar20 - 1];
                  if (local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar20 - 1] <= iVar3) {
                    __assert_fail("starts[i] < ends[i]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/util.h"
                                  ,0x50,
                                  "bool is_in_simulated_region(const int, const std::vector<int> &, const std::vector<int> &)"
                                 );
                  }
                  if ((iVar3 <= iVar10) &&
                     (iVar10 <= local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar20 - 1])) break;
                  bVar8 = uVar20 < uVar18;
                  bVar22 = uVar20 != uVar18;
                  uVar20 = uVar20 + 1;
                } while (bVar22);
                if (bVar8) {
                  if (bVar9 != false) {
                    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                    local_328._M_string_length = 0;
                    local_328.field_2._M_local_buf[0] = '\0';
                    Pdb::get_atom_rec_token(&local_328,&local_2f8,PdbAtomName);
                    iVar10 = std::__cxx11::string::compare((char *)&local_328);
                    bVar8 = true;
                    if ((((iVar10 != 0) &&
                         (iVar10 = std::__cxx11::string::compare((char *)&local_328), iVar10 != 0))
                        && (iVar10 = std::__cxx11::string::compare((char *)&local_328), iVar10 != 0)
                        ) && (iVar10 = std::__cxx11::string::compare((char *)&local_328),
                             iVar10 != 0)) {
                      iVar10 = std::__cxx11::string::compare((char *)&local_328);
                      bVar8 = iVar10 == 0;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p != &local_328.field_2) {
                      operator_delete(local_328._M_dataplus._M_p);
                    }
                    pvVar21 = local_240;
                    if (!bVar8) goto LAB_001193f6;
                  }
                  Pdb::parse_atom_coords(&local_268,&local_2f8);
                  __position._M_current =
                       pvVar21[-1].super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      pvVar21[-1].super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
                              (local_250,__position,&local_268);
                  }
                  else {
                    (__position._M_current)->z = local_268.z;
                    (__position._M_current)->x = local_268.x;
                    (__position._M_current)->y = local_268.y;
                    ppPVar2 = &pvVar21[-1].super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                               .super__Vector_impl_data._M_finish;
                    *ppPVar2 = *ppPVar2 + 1;
                  }
                }
              }
LAB_001193f6:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p);
          }
          std::ifstream::close();
          std::ifstream::~ifstream((istream *)&local_238);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: PDB file not found: ",0x1d);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_348._M_dataplus._M_p,
                               local_348._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
        }
        if (local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (bVar6) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_2d8,&local_348);
          uVar17 = local_2fc;
          uVar11 = (int)local_308 + 1;
          if (uVar11 == local_2fc) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Warning: Maximum number of conformations reached.\n",
                       0x32);
            iVar10 = 6;
            local_308 = (ulong)uVar17;
          }
          else {
            iVar10 = 0;
            local_308 = (ulong)uVar11;
            if ((uVar11 * 0x26e978d5 + 0x10624dc >> 2 | uVar11 * 0x40000000) < 0x83126f) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Processed file #",0x10);
              poVar12 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_308);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_348._M_dataplus._M_p,local_348._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              iVar10 = 0;
            }
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Error: unable to load ",0x16);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_348._M_dataplus._M_p,
                               local_348._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"std::endl",9);
          closedir(__dirp);
          iVar10 = 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p);
        }
      } while (iVar10 == 0);
      if (iVar10 != 6) goto LAB_00119815;
LAB_0011961a:
      closedir(__dirp);
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 !=
             (params->export_cl_csv_pdb_in_dirs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (((long)local_2b8.
               super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_2b8.
               super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        ((long)local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
      __assert_fail("confs.size() == confs_ls.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                    ,0x111,"void do_export_cl_csv_pdb(const Params &)");
    }
  }
  bVar9 = anon_unknown.dwarf_12919::write_pdbs_to_csv
                    (&local_2b8,&params->export_cl_csv_pdb_out_path);
  if (bVar9) {
    std::ofstream::ofstream(&local_238,(string *)&params->export_cl_csv_pdb_out_ls_path,_S_out);
    if (*(int *)((long)aiStack_218 + local_238[-3]) == 0) {
      if (local_2d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar19 = local_2d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_238,(pbVar19->_M_dataplus)._M_p,
                               pbVar19->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 !=
                 local_2d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::ofstream::close();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Full PDB to cluster CSV export finished successfully.\n",
                 0x36);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: failed to write cluster file list at: ",0x2d);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           (params->export_cl_csv_pdb_out_ls_path)._M_dataplus._M_p,
                           (params->export_cl_csv_pdb_out_ls_path)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
    }
    local_238 = _VTT;
    *(undefined8 *)((long)&local_238 + _VTT[-3]) = _log;
    std::filebuf::~filebuf((filebuf *)&lStack_230);
    std::ios_base::~ios_base(local_140);
  }
LAB_00119815:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  std::
  vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ::~vector(&local_2b8);
  return;
}

Assistant:

void do_export_cl_csv_pdb(const Params &params) {

    // Store loop regions as point arrays
    std::vector<SlimStruct> confs;

    // File path to each PDB used for clustering
    std::vector<std::string> confs_ls;

    // Determine maximum number of PDBs to load
    const int MAX_CONFS = (params.export_cl_csv_pdb_max > 0)
        ? params.export_cl_csv_pdb_max : INT_MAX;

    // Load loops
    int num_confs = 0;
    for (auto idir = params.export_cl_csv_pdb_in_dirs.cbegin();
         idir != params.export_cl_csv_pdb_in_dirs.cend(); ++idir) {

        const std::string &in_dir_path = *idir;
        std::cout << "Loading PDBs from: " << in_dir_path << std::endl;

        DIR *dir;
        struct dirent *ent;
        if ((dir = opendir(in_dir_path.c_str())) != NULL) {
            // Process all PDB files in this directory
            while ((ent = readdir(dir)) != NULL) {
                
                // Skip files without .pdb extension
                if (!is_pdb_fname(ent->d_name)) {
                    continue;
                }

                // Assume input directory does end in path separator.
                // Determine path to this PDB file
                const std::string pdb_path = in_dir_path + "/" + std::string(ent->d_name);

                // Load 
                confs.push_back(SlimStruct());
                if (load_conf(
                          confs.back()
                        , pdb_path
                        , params.starts
                        , params.ends
                        , params.export_cl_csv_pdb_bbone_only)) {
                    ++num_confs;
                    confs_ls.push_back(pdb_path);
                }
                else {
                    std::cout << "Error: unable to load " << pdb_path << "std::endl";
                    closedir(dir);
                    return;
                }

                if (num_confs == MAX_CONFS) {
                    std::cout << "Warning: Maximum number of conformations reached.\n";
                    break;
                }

                // Heartbeat
                if ((num_confs % DISGRO_SMC_REPORT_INTERVAL) == 0) {
                    std::cout << "Processed file #" << num_confs << ": " << pdb_path << std::endl;
                }
            }
            closedir(dir);
        }
        else {
            std::cout << "Error: could not open PDB directory: " << in_dir_path;
            return;
        }

    } // End iteration over PDB  input directories

    assert(confs.size() == confs_ls.size());

    if (!write_pdbs_to_csv(confs, params.export_cl_csv_pdb_out_path)) {
        // Export failed"
        return;
    }

    // write ls file
    std::ofstream fls(params.export_cl_csv_pdb_out_ls_path);
    if (!fls.good()) {
        std::cout << "Error: failed to write cluster file list at: "
                  << params.export_cl_csv_pdb_out_ls_path << std::endl;
        return;
    }
    for (auto ils = confs_ls.cbegin(); ils != confs_ls.cend(); ++ils) {
        fls << *ils << std::endl;
    }
    fls.close();

    std::cout << "Full PDB to cluster CSV export finished successfully.\n";
}